

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall google::protobuf::anon_unknown_0::MetadataOwner::~MetadataOwner(MetadataOwner *this)

{
  Metadata *pMVar1;
  bool bVar2;
  reference ppVar3;
  __normal_iterator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_*,_std::vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>_>
  *in_RDI;
  Metadata *m;
  pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*> range;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>
  *__range3;
  Reflection *in_stack_ffffffffffffffb8;
  Metadata *local_38;
  Metadata *in_stack_ffffffffffffffd0;
  __normal_iterator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_*,_std::vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>_>
  local_18;
  __normal_iterator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_*,_std::vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>_>
  *local_10;
  
  local_10 = in_RDI + 5;
  local_18._M_current =
       (pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*> *)
       std::
       vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>
       ::begin((vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>
                *)in_stack_ffffffffffffffb8);
  std::
  vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>
  ::end((vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>
         *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_*,_std::vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar2) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_*,_std::vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>_>
             ::operator*(&local_18);
    pMVar1 = ppVar3->second;
    local_38 = ppVar3->first;
    in_stack_ffffffffffffffd0 = local_38;
    for (; local_38 < pMVar1; local_38 = local_38 + 1) {
      in_stack_ffffffffffffffb8 = local_38->reflection;
      if (in_stack_ffffffffffffffb8 != (Reflection *)0x0) {
        operator_delete(in_stack_ffffffffffffffb8);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_*,_std::vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>
  ::~vector((vector<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>,_std::allocator<std::pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*>_>_>
             *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

~MetadataOwner() {
    for (auto range : metadata_arrays_) {
      for (const Metadata* m = range.first; m < range.second; m++) {
        delete m->reflection;
      }
    }
  }